

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testValidUpsampleAlignCorners(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  int32_t iVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  Arena *pAVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *this_00;
  NeuralNetwork *this_01;
  NeuralNetworkLayer *this_02;
  ostream *poVar7;
  Model *this_03;
  undefined1 local_110 [8];
  Model mlmodel;
  undefined1 local_c8 [8];
  Result res;
  UpsampleLayerParams *params;
  NeuralNetworkLayer *upsampleLayer;
  NeuralNetwork *nn;
  FeatureDescription *out3;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"input",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,5);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,5);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  pAVar5 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar4->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"probs",pAVar5);
  pFVar6 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar6);
  this_01 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_01,EXACT_ARRAY_MAPPING);
  this_02 = CoreML::Specification::NeuralNetwork::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_upsample(this_02)
  ;
  CoreML::Specification::UpsampleLayerParams::add_scalingfactor
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::Specification::UpsampleLayerParams::add_scalingfactor
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,1);
  CoreML::Specification::UpsampleLayerParams::set_mode
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
             UpsampleLayerParams_InterpolationMode_BILINEAR);
  CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
            ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
             UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);
  CoreML::validate<(MLModelType)500>((Result *)local_c8,(Model *)&topIn);
  bVar1 = CoreML::Result::good((Result *)local_c8);
  if (bVar1) {
    CoreML::Specification::UpsampleLayerParams::set_linearupsamplemode
              ((UpsampleLayerParams *)res.m_message.field_2._8_8_,
               UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);
    CoreML::validate<(MLModelType)500>
              ((Result *)
               &mlmodel.m_spec.
                super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(Model *)&topIn);
    this = &mlmodel.m_spec.
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ;
    CoreML::Result::operator=((Result *)local_c8,(Result *)this);
    CoreML::Result::~Result((Result *)this);
    bVar1 = CoreML::Result::good((Result *)local_c8);
    if (bVar1) {
      CoreML::Model::Model((Model *)local_110,(Model *)&topIn);
      this_03 = CoreML::Model::getProto((Model *)local_110);
      iVar2 = CoreML::Specification::Model::specificationversion(this_03);
      if (iVar2 != 5) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc6d);
        poVar7 = std::operator<<(poVar7,": error: ");
        poVar7 = std::operator<<(poVar7,
                                 "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14"
                                );
        poVar7 = std::operator<<(poVar7," was false, expected true.");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      }
      m1._oneof_case_[0]._1_3_ = 0;
      m1._oneof_case_[0]._0_1_ = iVar2 != 5;
      CoreML::Model::~Model((Model *)local_110);
    }
    else {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc69);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,"(res).good()");
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      m1._oneof_case_[0] = 1;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0xc64);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
  }
  CoreML::Result::~Result((Result *)local_c8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testValidUpsampleAlignCorners() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(5);
    shape->add_shape(5);
    shape->add_shape(5);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer *upsampleLayer = nn->add_layers();
    upsampleLayer->add_input("input");
    upsampleLayer->add_output("probs");
    auto *params = upsampleLayer->mutable_upsample();

    // Scaling factor needs to be 2D
    params->add_scalingfactor(1.0);
    params->add_scalingfactor(1.0);

    params->set_mode(Specification::UpsampleLayerParams_InterpolationMode_BILINEAR);
    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_FALSE);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    params->set_linearupsamplemode(Specification::UpsampleLayerParams_LinearUpsampleMode_ALIGN_CORNERS_TRUE);

    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Check that the new field sets spec version to ios 14
    Model mlmodel = Model(m1);
    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS14);
    return 0;
}